

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> * __thiscall
cmLocalGenerator::AddUnityFilesModeAuto
          (vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *lang,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *filtered_sources,cmValue beforeInclude,cmValue afterInclude,
          string *filename_base,size_t batchSize)

{
  string filename_00;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  sources;
  undefined8 uVar4;
  undefined8 in_stack_ffffffffffffff08;
  unsigned_long local_e0;
  string filename;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string extension;
  UnitySource local_58;
  
  uVar2 = (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (batchSize == 0) {
    batchSize = uVar2;
  }
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0 = 0;
  do {
    if (uVar2 == 0) {
      return __return_storage_ptr__;
    }
    uVar3 = uVar2;
    if (batchSize < uVar2) {
      uVar3 = batchSize;
    }
    extension._M_dataplus._M_p = (pointer)&extension.field_2;
    extension._M_string_length = 0;
    extension.field_2._M_local_buf[0] = '\0';
    bVar1 = std::operator==(lang,"C");
    if (bVar1) {
LAB_001ada37:
      std::__cxx11::string::assign((char *)&extension);
    }
    else {
      bVar1 = std::operator==(lang,"CXX");
      if (bVar1) goto LAB_001ada37;
      bVar1 = std::operator==(lang,"OBJC");
      if (bVar1) goto LAB_001ada37;
      bVar1 = std::operator==(lang,"OBJCXX");
      if (bVar1) goto LAB_001ada37;
    }
    uVar4 = 0x1ada6a;
    cmStrCat<std::__cxx11::string_const&,char_const(&)[7],unsigned_long&,std::__cxx11::string&>
              (&filename,filename_base,(char (*) [7])0x68be28,&local_e0,&extension);
    sources.Begin._M_current =
         (filtered_sources->
         super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
         )._M_impl.super__Vector_impl_data._M_start + local_e0 * batchSize;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p == &filename.field_2) {
      local_88._8_8_ = filename.field_2._8_8_;
      local_98 = &local_88;
    }
    else {
      local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)filename._M_dataplus._M_p;
    }
    local_88._M_allocated_capacity._1_7_ = filename.field_2._M_allocated_capacity._1_7_;
    local_88._M_local_buf[0] = filename.field_2._M_local_buf[0];
    sources.End._M_current = sources.Begin._M_current + uVar3;
    local_90 = filename._M_string_length;
    filename._M_string_length = 0;
    filename.field_2._M_local_buf[0] = '\0';
    filename_00._M_string_length = uVar4;
    filename_00._M_dataplus._M_p = (pointer)&local_98;
    filename_00.field_2._M_allocated_capacity = in_stack_ffffffffffffff08;
    filename_00.field_2._8_8_ = lang;
    filename._M_dataplus._M_p = (pointer)&filename.field_2;
    WriteUnitySource(&local_58,this,target,configs,sources,beforeInclude,afterInclude,filename_00);
    std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
    emplace_back<cmLocalGenerator::UnitySource>(__return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&extension);
    uVar2 = uVar2 - uVar3;
    local_e0 = local_e0 + 1;
  } while( true );
}

Assistant:

std::vector<cmLocalGenerator::UnitySource>
cmLocalGenerator::AddUnityFilesModeAuto(
  cmGeneratorTarget* target, std::string const& lang,
  std::vector<std::string> const& configs,
  std::vector<UnityBatchedSource> const& filtered_sources,
  cmValue beforeInclude, cmValue afterInclude,
  std::string const& filename_base, size_t batchSize)
{
  if (batchSize == 0) {
    batchSize = filtered_sources.size();
  }

  std::vector<UnitySource> unity_files;
  for (size_t itemsLeft = filtered_sources.size(), chunk, batch = 0;
       itemsLeft > 0; itemsLeft -= chunk, ++batch) {

    chunk = std::min(itemsLeft, batchSize);

    std::string extension;
    if (lang == "C") {
      extension = "_c.c";
    } else if (lang == "CXX") {
      extension = "_cxx.cxx";
    } else if (lang == "OBJC") {
      extension = "_m.m";
    } else if (lang == "OBJCXX") {
      extension = "_mm.mm";
    }
    std::string filename = cmStrCat(filename_base, "unity_", batch, extension);
    auto const begin = filtered_sources.begin() + batch * batchSize;
    auto const end = begin + chunk;
    unity_files.emplace_back(this->WriteUnitySource(
      target, configs, cmMakeRange(begin, end), beforeInclude, afterInclude,
      std::move(filename)));
  }
  return unity_files;
}